

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kgc.cpp
# Opt level: O1

void __thiscall Kgc::mark(Kgc *this,Value *v)

{
  long lVar1;
  CompoundProc *cp;
  long lVar2;
  
  for (; (((ulong)v & 3) == 0 && (v->marked_ == 0)); v = *(Value **)((long)&v->_vptr_Value + lVar2))
  {
    v->marked_ = 1;
    if (v->type_ == CELL) {
      lVar2 = 0x20;
      lVar1 = 0x18;
    }
    else {
      if (v->type_ != COMP_PROC) {
        return;
      }
      mark(this,(Value *)v[1]._vptr_Value);
      lVar2 = 0x28;
      lVar1 = 0x20;
    }
    mark(this,*(Value **)((long)&v->_vptr_Value + lVar1));
  }
  return;
}

Assistant:

void Kgc::mark(const Value *v)
{
    if (IS_INT(v) || IS_CHR(v)) return;
    if (v->marked_) return;
    
    v->marked_ = 1;
    if (v->type() == ValueType::CELL)
    {
        const Cell *c = static_cast<const Cell *>(v);
        mark(c->head_);
        mark(c->tail_);
    } else if (v->type() == ValueType::COMP_PROC)
    {
        const CompoundProc *cp = static_cast<const CompoundProc *>(v);
        mark(cp->parameters_);
        mark(cp->body_);
        mark(cp->env_);
    }
}